

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_leb.c
# Opt level: O1

int dwarf_encode_signed_leb128(Dwarf_Signed value,int *nbytes,char *space,int splen)

{
  bool bVar1;
  byte bVar2;
  Dwarf_Signed DVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  DVar3 = value;
  pbVar4 = (byte *)space;
  while( true ) {
    if (pbVar4 < space + splen) {
      if ((DVar3 >> 7 == value >> 0x3f) && ((((uint)DVar3 ^ (uint)(value >> 0x3f)) & 0x40) == 0)) {
        bVar2 = (byte)DVar3 & 0x7f;
        bVar1 = true;
      }
      else {
        bVar2 = (byte)DVar3 | 0x80;
        bVar1 = false;
      }
      *pbVar4 = bVar2;
      pbVar5 = pbVar4 + 1;
    }
    else {
      bVar1 = false;
      pbVar5 = pbVar4;
    }
    if (space + splen <= pbVar4) break;
    DVar3 = DVar3 >> 7;
    pbVar4 = pbVar5;
    if (bVar1) {
      *nbytes = (int)pbVar5 - (int)space;
      return 0;
    }
  }
  return 1;
}

Assistant:

int dwarf_encode_signed_leb128(Dwarf_Signed value, int *nbytes,
    char *space, int splen)
{
    char *str;
    Dwarf_Signed sign = -(value < 0);
    int more = 1;
    char *end = space + splen;

    str = space;

    do {
        unsigned char byte = value & DATA_MASK;

        value >>= DIGIT_WIDTH;

        if (str >= end) {
            return DW_DLV_ERROR;
        }
        /*  Remaining chunks would just contain the sign
            bit, and this chunk
            has already captured at least one sign bit.  */
        if (value == sign &&
            ((byte & SIGN_BIT) == (sign & SIGN_BIT))) {
            more = 0;
        } else {
            byte |= MORE_BYTES;
        }
        *str = byte;
        str++;
    } while (more);
    *nbytes = (int)(str - space);
    return DW_DLV_OK;
}